

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O0

LispPTR makefreearrayblock(LispPTR block,DLword length)

{
  LispPTR *pLVar1;
  abdum *dbase;
  arrayblock *bbase;
  LispPTR trailer;
  DLword length_local;
  LispPTR block_local;
  
  pLVar1 = NativeAligned4FromLAddr(block);
  *(undefined2 *)((ulong)pLVar1 ^ 2) = 0xaaa8;
  *(DLword *)pLVar1 = length;
  pLVar1 = NativeAligned4FromLAddr(block + ((ushort)*pLVar1 - 1) * 2);
  *(undefined2 *)((ulong)pLVar1 ^ 2) = 0xaaa8;
  *(DLword *)pLVar1 = length;
  return block;
}

Assistant:

LispPTR makefreearrayblock(LispPTR block, DLword length) {
  LispPTR trailer;
  struct arrayblock *bbase;
  struct abdum *dbase;
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(block);
  dbase = (struct abdum *)WORDPTR(bbase);
  dbase->abflags = FREEARRAYFLAGWORD;
  bbase->arlen = length;
  trailer = Trailer(block, bbase);
  bbase = (struct arrayblock *)NativeAligned4FromLAddr(trailer);
  dbase = (struct abdum *)WORDPTR(bbase);
  dbase->abflags = FREEARRAYFLAGWORD;
  bbase->arlen = length;
  return (block);
}